

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAllocPtr alloc)

{
  byte bVar1;
  uint uVar2;
  UInt32 UVar3;
  Byte *pBVar4;
  CLzRef *pCVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar2 = historySize + keepAddBufferBefore + 1;
  p->keepSizeBefore = uVar2;
  uVar9 = keepAddBufferAfter + matchMaxLen;
  if (keepAddBufferAfter + matchMaxLen <= p->numHashBytes) {
    uVar9 = p->numHashBytes;
  }
  p->keepSizeAfter = uVar9;
  if (p->directInput == '\0') {
    uVar8 = uVar9 + uVar2;
    if (uVar2 < historySize || CARRY4(uVar9,uVar2)) goto LAB_00194da3;
    uVar2 = uVar8 >> (2U - (uVar8 < 0x40000000) & 0x1f);
    uVar9 = uVar2 + uVar8 + 0x11080 & 0xffff0000;
    if (-uVar8 - 0x10000 <= uVar2 + 0x11080) {
      uVar9 = 0xffff0000;
    }
    if (((0xfffeffff < uVar8) || (-uVar8 - 0x10000 < 0x1000000)) || (uVar9 == 0)) goto LAB_00194da3;
    if ((p->bufBase == (Byte *)0x0) || (p->blockSize != uVar9)) {
      (*alloc->Free)(alloc,p->bufBase);
      p->bufBase = (Byte *)0x0;
      p->blockSize = uVar9;
      pBVar4 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar9);
      p->bufBase = pBVar4;
      if (pBVar4 == (Byte *)0x0) goto LAB_00194da3;
    }
  }
  else {
    p->blockSize = 0;
  }
  bVar1 = p->numHashOutBits;
  if (bVar1 == 0) {
    uVar9 = p->numHashBytes;
    uVar2 = MatchFinder_GetHashMask((CMatchFinder *)(ulong)uVar9,historySize);
    uVar11 = (ulong)uVar2;
    if ((ulong)historySize <= p->expectedDataSize) goto LAB_00194cd8;
    UVar3 = MatchFinder_GetHashMask((CMatchFinder *)(ulong)uVar9,(UInt32)p->expectedDataSize);
    if (UVar3 < uVar2) {
      uVar2 = UVar3;
    }
  }
  else {
    uVar9 = p->numHashBytes;
    bVar6 = 0x10;
    if (uVar9 != 2) {
      bVar6 = (uVar9 != 3) * '\b' + 0x18;
    }
    if (bVar1 <= bVar6) {
      bVar6 = bVar1;
    }
    uVar2 = ~(-1 << (bVar6 & 0x1f)) | 0xffff;
    if (0x1f < bVar6) {
      uVar2 = 0xffffffff;
    }
    uVar8 = uVar2 | 0x3ffff;
    if (uVar9 < 5) {
      uVar8 = uVar2;
    }
    UVar3 = MatchFinder_GetHashMask2((CMatchFinder *)(ulong)uVar9,historySize);
    if (UVar3 <= uVar8) {
      uVar8 = UVar3;
    }
    uVar11 = (ulong)uVar8;
    if (p->expectedDataSize < (ulong)historySize) {
      uVar2 = MatchFinder_GetHashMask2((CMatchFinder *)(ulong)uVar9,(UInt32)p->expectedDataSize);
      if (uVar8 < uVar2) {
        uVar2 = uVar8;
      }
    }
    else {
LAB_00194cd8:
      uVar2 = (uint)uVar11;
    }
  }
  uVar8 = historySize + 1;
  p->hashMask = uVar2;
  uVar2 = 0;
  if (2 < uVar9) {
    uVar2 = (uint)(p->numHashBytes_Min < 3) << 10;
    if ((uVar9 != 3) && (uVar2 = uVar2 | 0x10000, 3 < p->numHashBytes_Min)) {
      uVar2 = 0;
    }
  }
  p->fixedHashSize = uVar2;
  p->matchMaxLen = matchMaxLen;
  p->historySize = historySize;
  p->cyclicBufferSize = uVar8;
  uVar7 = (ulong)uVar8 << (p->btMode != '\0');
  if (uVar7 < uVar8) {
    return 0;
  }
  lVar10 = (ulong)uVar2 + uVar11 + 1;
  uVar11 = lVar10 + uVar7 + 0xf & 0xfffffffffffffff0;
  if ((p->hash != (CLzRef *)0x0) && (uVar11 <= p->numRefs)) {
    return 1;
  }
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  p->numRefs = uVar11;
  pCVar5 = (CLzRef *)(*alloc->Alloc)(alloc,uVar11 << 2);
  p->hash = pCVar5;
  if (pCVar5 != (CLzRef *)0x0) {
    p->son = pCVar5 + lVar10;
    return 1;
  }
LAB_00194da3:
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  (*alloc->Free)(alloc,p->bufBase);
  p->bufBase = (Byte *)0x0;
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAllocPtr alloc)
{
  /* we need one additional byte in (p->keepSizeBefore),
     since we use MoveBlock() after (p->pos++) and before dictionary using */
  // keepAddBufferBefore = (UInt32)0xFFFFFFFF - (1 << 22); // for debug
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;

  keepAddBufferAfter += matchMaxLen;
  /* we need (p->keepSizeAfter >= p->numHashBytes) */
  if (keepAddBufferAfter < p->numHashBytes)
    keepAddBufferAfter = p->numHashBytes;
  // keepAddBufferAfter -= 2; // for debug
  p->keepSizeAfter = keepAddBufferAfter;

  if (p->directInput)
    p->blockSize = 0;
  if (p->directInput || LzInWindow_Create2(p, GetBlockSize(p, historySize), alloc))
  {
    size_t hashSizeSum;
    {
      UInt32 hs;
      UInt32 hsCur;
      
      if (p->numHashOutBits != 0)
      {
        unsigned numBits = p->numHashOutBits;
        const unsigned nbMax =
            (p->numHashBytes == 2 ? 16 :
            (p->numHashBytes == 3 ? 24 : 32));
        if (numBits > nbMax)
          numBits = nbMax;
        if (numBits >= 32)
          hs = (UInt32)0 - 1;
        else
          hs = ((UInt32)1 << numBits) - 1;
        // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
        hs |= (1 << 16) - 1; /* don't change it! */
        if (p->numHashBytes >= 5)
          hs |= (256 << kLzHash_CrcShift_2) - 1;
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, historySize);
          if (hs > hs2)
            hs = hs2;
        }
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs2)
            hsCur = hs2;
        }
      }
      else
      {
        hs = MatchFinder_GetHashMask(p, historySize);
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          hsCur = MatchFinder_GetHashMask(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs) // is it possible?
            hsCur = hs;
        }
      }

      p->hashMask = hsCur;

      hashSizeSum = hs;
      hashSizeSum++;
      if (hashSizeSum < hs)
        return 0;
      {
        UInt32 fixedHashSize = 0;
        if (p->numHashBytes > 2 && p->numHashBytes_Min <= 2) fixedHashSize += kHash2Size;
        if (p->numHashBytes > 3 && p->numHashBytes_Min <= 3) fixedHashSize += kHash3Size;
        // if (p->numHashBytes > 4) p->fixedHashSize += hs4; // kHash4Size;
        hashSizeSum += fixedHashSize;
        p->fixedHashSize = fixedHashSize;
      }
    }

    p->matchMaxLen = matchMaxLen;

    {
      size_t newSize;
      size_t numSons;
      const UInt32 newCyclicBufferSize = historySize + 1; // do not change it
      p->historySize = historySize;
      p->cyclicBufferSize = newCyclicBufferSize; // it must be = (historySize + 1)
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hashSizeSum + numSons;

      if (numSons < newCyclicBufferSize || newSize < numSons)
        return 0;

      // aligned size is not required here, but it can be better for some loops
      #define NUM_REFS_ALIGN_MASK 0xF
      newSize = (newSize + NUM_REFS_ALIGN_MASK) & ~(size_t)NUM_REFS_ALIGN_MASK;

      // 22.02: we don't reallocate buffer, if old size is enough
      if (p->hash && p->numRefs >= newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}